

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeFunction<true,false,true,true>
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  _func_int **pp_Var1;
  bool bVar2;
  ArgSlot AVar3;
  int iVar4;
  JavascriptFunction *obj;
  ScriptFunction *this_00;
  long lVar5;
  DynamicObject *pDVar6;
  FunctionProxy *this_01;
  ParseableFunctionInfo *this_02;
  
  obj = VarTo<Js::JavascriptFunction,Js::DynamicObject>(instance);
  this = (((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
  bVar2 = VarIsImpl<Js::ScriptFunction>((RecyclableObject *)obj);
  if (bVar2) {
    this_00 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    iVar4 = (*(this_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x77])(this_00);
    lVar5 = 0xd60;
    if ((char)iVar4 != '\0') {
      lVar5 = 0xd48;
    }
  }
  else {
    lVar5 = 0xd60;
    this_00 = (ScriptFunction *)0x0;
  }
  DeferredTypeHandlerBase::ConvertFunction
            (typeHandler,obj,
             *(DynamicTypeHandler **)
              ((long)&(this->super_JavascriptLibraryBase).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar5));
  pDVar6 = CreateConstructorPrototypeObject(this,obj);
  if (this_00 == (ScriptFunction *)0x0) {
    (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])(obj,0x124,pDVar6,0,0);
  }
  else {
    pp_Var1 = (obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    if ((((this_00->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->attributes
        & ClassConstructor) == None) {
      (*pp_Var1[0x17])(obj,0x124,pDVar6,0,0);
    }
    else {
      (*pp_Var1[0x1e])(obj,0x124,pDVar6,0,0,0,0xf);
    }
    this_01 = ScriptFunction::GetFunctionProxy(this_00);
    this_02 = FunctionProxy::EnsureDeserialized(this_01);
    AVar3 = ParseableFunctionInfo::GetReportedInParamsCount(this_02);
    (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (obj,0xd1,(ulong)(AVar3 - 1) | 0x1000000000000,2,0,0,0);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunction(DynamicObject *instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptFunction * function = VarTo<JavascriptFunction>(instance);
        JavascriptLibrary* javascriptLibrary = function->GetType()->GetLibrary();
        ScriptFunction *scriptFunction = nullptr;
        bool useAnonymous = false;
        if (VarIs<ScriptFunction>(function))
        {
            scriptFunction = Js::VarTo<Js::ScriptFunction>(function);
            useAnonymous = scriptFunction->IsAnonymousFunction();
        }

        if (!addPrototype)
        {
            if (!useAnonymous && addName)
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionTypeHandlerWithLength : javascriptLibrary->functionTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionTypeHandler);
            }
        }
        else
        {
            if (useAnonymous)
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionWithPrototypeTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionWithPrototypeAndLengthTypeHandler : javascriptLibrary->functionWithPrototypeTypeHandler);
            }
            DynamicObject *protoObject = javascriptLibrary->CreateConstructorPrototypeObject(function);
            if (scriptFunction && scriptFunction->GetFunctionInfo()->IsClassConstructor())
            {
                function->SetPropertyWithAttributes(PropertyIds::prototype, protoObject, PropertyNone, nullptr);
            }
            else
            {
                function->SetProperty(PropertyIds::prototype, protoObject, PropertyOperation_None, nullptr);
            }
        }

        if (scriptFunction)
        {
            ParseableFunctionInfo * funcInfo = scriptFunction->GetFunctionProxy()->EnsureDeserialized();

            CompileAssert(!addLength || useLengthType);
            if (addLength)
            {
                function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(funcInfo->GetReportedInParamsCount() - 1), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
            }

            if (useAnonymous || funcInfo->GetIsStaticNameFunction())
            {
                return true;
            }
        }

        if (addName)
        {
            JavascriptString * functionName = nullptr;
            if (((Js::JavascriptFunction*)function)->GetFunctionName(&functionName))
            {
                function->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
        }

        return true;
    }